

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

void __thiscall SaveButton::~SaveButton(SaveButton *this)

{
  void *in_RDI;
  
  ~SaveButton((SaveButton *)0x10ce58);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}